

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::FileEntry::FileEntry(FileEntry *this,uint64_t ofs,uint8_t *pdata)

{
  uint32_t uVar1;
  string *__return_storage_ptr__;
  uint64_t uVar2;
  uint8_t *pdata_local;
  uint64_t ofs_local;
  FileEntry *this_local;
  
  DirEntry::DirEntry(&this->super_DirEntry,ofs);
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__FileEntry_0019c2e0;
  nameinfo::nameinfo(&this->_name,pdata + 0xc);
  uVar1 = get32le<unsigned_char_const*>(pdata);
  (this->super_DirEntry)._magic = uVar1;
  if (((this->super_DirEntry)._magic & 0xfffff7ff) != 0xfffff6fe) {
    __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
    uVar1 = DirEntry::offset(&this->super_DirEntry);
    stringformat_abi_cxx11_
              (__return_storage_ptr__,"FileEntry@%08x: invalid magic: %08x",(ulong)uVar1,
               (ulong)(this->super_DirEntry)._magic);
    __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
               );
  }
  uVar1 = get32le<unsigned_char_const*>(pdata + 4);
  this->_datatable = uVar1;
  uVar1 = get32le<unsigned_char_const*>(pdata + 8);
  this->_sectionlist = uVar1;
  uVar1 = get32le<unsigned_char_const*>(pdata + 0x18);
  (this->super_DirEntry)._size = uVar1;
  uVar1 = get32le<unsigned_char_const*>(pdata + 0x1c);
  this->_attr = uVar1;
  uVar2 = get64le<unsigned_char_const*>(pdata + 0x20);
  this->_filetime = uVar2;
  uVar1 = get32le<unsigned_char_const*>(pdata + 0x28);
  this->_reserved = uVar1;
  uVar1 = get32le<unsigned_char_const*>(pdata + 0x2c);
  (this->super_DirEntry)._indexptr = uVar1;
  uVar1 = get32le<unsigned_char_const*>(pdata + 0x30);
  (this->super_DirEntry)._indexsize = uVar1;
  if (this->_datatable != 0) {
    printf("warning: file datatable= %08x\n",(ulong)this->_datatable);
  }
  return;
}

Assistant:

FileEntry(uint64_t ofs, const uint8_t *pdata)
            : DirEntry(ofs), _name(pdata+12)
        {
            _magic= get32le(pdata);
            if ((_magic&~0x800)!=MAGIC)
                throw stringformat("FileEntry@%08x: invalid magic: %08x", offset(), _magic);

            _datatable= get32le(pdata+4);
            _sectionlist= get32le(pdata+8);
            //name : pdata+12
            _size= get32le(pdata+24);
            _attr= get32le(pdata+28);
            _filetime= get64le(pdata+32);
            _reserved= get32le(pdata+40);
            _indexptr= get32le(pdata+44);
            _indexsize= get32le(pdata+48);

            if (_datatable)
                printf("warning: file datatable= %08x\n", _datatable);
        }